

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemNumerify(Mem *pMem)

{
  int iVar1;
  MemValue local_20;
  sqlite3_int64 ix;
  Mem *pMStack_10;
  int rc;
  Mem *pMem_local;
  
  pMStack_10 = pMem;
  if ((pMem->flags & 0x2d) == 0) {
    ix._4_4_ = sqlite3AtoF(pMem->z,(double *)pMem,pMem->n,pMem->enc);
    if (((ix._4_4_ != 0) && (ix._4_4_ != 1)) ||
       (iVar1 = sqlite3Atoi64(pMStack_10->z,&local_20.i,pMStack_10->n,pMStack_10->enc), 1 < iVar1))
    {
      local_20.i = (i64)(pMStack_10->u).r;
      iVar1 = sqlite3RealSameAsInt((pMStack_10->u).r,local_20.i);
      if (iVar1 == 0) {
        pMStack_10->flags = pMStack_10->flags & 0xf240 | 8;
        goto LAB_00165888;
      }
    }
    pMStack_10->u = local_20;
    pMStack_10->flags = pMStack_10->flags & 0xf240 | 4;
  }
LAB_00165888:
  pMStack_10->flags = pMStack_10->flags & 0xfbed;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNumerify(Mem *pMem){
  assert( pMem!=0 );
  testcase( pMem->flags & MEM_Int );
  testcase( pMem->flags & MEM_Real );
  testcase( pMem->flags & MEM_IntReal );
  testcase( pMem->flags & MEM_Null );
  if( (pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal|MEM_Null))==0 ){
    int rc;
    sqlite3_int64 ix;
    assert( (pMem->flags & (MEM_Blob|MEM_Str))!=0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    rc = sqlite3AtoF(pMem->z, &pMem->u.r, pMem->n, pMem->enc);
    if( ((rc==0 || rc==1) && sqlite3Atoi64(pMem->z, &ix, pMem->n, pMem->enc)<=1)
     || sqlite3RealSameAsInt(pMem->u.r, (ix = (i64)pMem->u.r))
    ){
      pMem->u.i = ix;
      MemSetTypeFlag(pMem, MEM_Int);
    }else{
      MemSetTypeFlag(pMem, MEM_Real);
    }
  }
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal|MEM_Null))!=0 );
  pMem->flags &= ~(MEM_Str|MEM_Blob|MEM_Zero);
  return SQLITE_OK;
}